

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

void trie_destroy(trie t)

{
  int iVar1;
  trie_node __ptr;
  
  if (t != (trie)0x0) {
    if ((t->root == (trie_node)0x0) || (iVar1 = trie_node_clear(t,t->root), iVar1 != 0)) {
      log_write_impl_va("metacall",0x329,"trie_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                        ,3,"Trie invalid destruction");
    }
    __ptr = t->node_list;
    if (__ptr != (trie_node)0x0) goto LAB_00104c01;
    while (__ptr = (trie_node)t->free_node_list, __ptr != (trie_node)0x0) {
      t->free_node_list = (trie_node_free_conflict)__ptr->parent_index;
LAB_00104c01:
      free(__ptr);
    }
    free(t);
    return;
  }
  return;
}

Assistant:

void trie_destroy(trie t)
{
	if (t != NULL)
	{
		if (trie_clear(t) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid destruction");
		}

		if (t->node_list != NULL)
		{
			free(t->node_list);
		}

		while (t->free_node_list != NULL)
		{
			trie_node_free free_node = t->free_node_list;

			t->free_node_list = t->free_node_list->next;

			free(free_node);
		}

		free(t);
	}
}